

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ConditionalPathDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConditionalPathDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::syntax::PathDeclarationSyntax&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,ExpressionSyntax *args_3,Token *args_4,
          PathDeclarationSyntax *args_5)

{
  Info *pIVar1;
  Info *pIVar2;
  size_type sVar3;
  pointer ppAVar4;
  Info *pIVar5;
  SyntaxKind SVar6;
  undefined4 uVar7;
  TokenKind TVar8;
  undefined1 uVar9;
  NumericTokenFlags NVar10;
  uint32_t uVar11;
  TokenKind TVar12;
  undefined1 uVar13;
  NumericTokenFlags NVar14;
  uint32_t uVar15;
  TokenKind TVar16;
  undefined1 uVar17;
  NumericTokenFlags NVar18;
  uint32_t uVar19;
  ConditionalPathDeclarationSyntax *pCVar20;
  long lVar21;
  
  pCVar20 = (ConditionalPathDeclarationSyntax *)
            ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ConditionalPathDeclarationSyntax *)this->endPtr < pCVar20 + 1) {
    pCVar20 = (ConditionalPathDeclarationSyntax *)allocateSlow(this,0x80,8);
  }
  else {
    this->head->current = (byte *)(pCVar20 + 1);
  }
  TVar8 = args_1->kind;
  uVar9 = args_1->field_0x2;
  NVar10.raw = (args_1->numFlags).raw;
  uVar11 = args_1->rawLen;
  pIVar1 = args_1->info;
  TVar12 = args_2->kind;
  uVar13 = args_2->field_0x2;
  NVar14.raw = (args_2->numFlags).raw;
  uVar15 = args_2->rawLen;
  pIVar2 = args_2->info;
  TVar16 = args_4->kind;
  uVar17 = args_4->field_0x2;
  NVar18.raw = (args_4->numFlags).raw;
  uVar19 = args_4->rawLen;
  pIVar5 = args_4->info;
  (pCVar20->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pCVar20->super_MemberSyntax).super_SyntaxNode.kind = ConditionalPathDeclaration;
  SVar6 = (args->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar7 = *(undefined4 *)&(args->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (pCVar20->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (args->super_SyntaxListBase).super_SyntaxNode.parent;
  (pCVar20->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind = SVar6;
  *(undefined4 *)
   &(pCVar20->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar7
  ;
  (pCVar20->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_004e9f08;
  (pCVar20->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_SyntaxListBase).childCount;
  sVar3 = (args->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).size_
  ;
  (pCVar20->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
       (args->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).data_;
  (pCVar20->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar3;
  (pCVar20->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_004ea348;
  (pCVar20->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)pCVar20;
  sVar3 = (pCVar20->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_;
  if (sVar3 != 0) {
    ppAVar4 = (pCVar20->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_;
    lVar21 = 0;
    do {
      **(undefined8 **)((long)ppAVar4 + lVar21) = pCVar20;
      lVar21 = lVar21 + 8;
    } while (sVar3 << 3 != lVar21);
  }
  (pCVar20->keyword).kind = TVar8;
  (pCVar20->keyword).field_0x2 = uVar9;
  (pCVar20->keyword).numFlags = (NumericTokenFlags)NVar10.raw;
  (pCVar20->keyword).rawLen = uVar11;
  (pCVar20->keyword).info = pIVar1;
  (pCVar20->openParen).kind = TVar12;
  (pCVar20->openParen).field_0x2 = uVar13;
  (pCVar20->openParen).numFlags = (NumericTokenFlags)NVar14.raw;
  (pCVar20->openParen).rawLen = uVar15;
  (pCVar20->openParen).info = pIVar2;
  (pCVar20->predicate).ptr = args_3;
  (pCVar20->closeParen).kind = TVar16;
  (pCVar20->closeParen).field_0x2 = uVar17;
  (pCVar20->closeParen).numFlags = (NumericTokenFlags)NVar18.raw;
  (pCVar20->closeParen).rawLen = uVar19;
  (pCVar20->closeParen).info = pIVar5;
  (pCVar20->path).ptr = args_5;
  (args_3->super_SyntaxNode).parent = (SyntaxNode *)pCVar20;
  (args_5->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)pCVar20;
  return pCVar20;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }